

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O1

void logUnsigned<unsigned_char>(void)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> eventSourceId;
  int iVar3;
  cx_string<4UL> cVar4;
  size_t sVar5;
  Session *pSVar6;
  undefined8 uVar7;
  long lVar8;
  long *in_FS_OFFSET;
  uchar b;
  uchar a;
  timespec ts;
  uchar local_112 [2];
  cx_string<1UL> local_110;
  cx_string<1UL> local_10e;
  cx_string<1UL> local_10c;
  cx_string<1UL> local_10a;
  string local_108;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_112[1] = 0x14;
  local_112[0] = '\x1e';
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,&local_108);
    logUnsigned<unsigned_char>();
  }
  lVar1 = *in_FS_OFFSET;
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,&local_108);
        logUnsigned<unsigned_char>();
      }
      __mutex = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      local_d8._M_p = (pointer)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"logUnsigned","");
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,"");
      local_78 = 0x15;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{} {} {} {}","");
      local_10a._data[0] = 'B';
      local_10a._data[1] = '\0';
      local_10c._data[0] = 'B';
      local_10c._data[1] = '\0';
      local_10e._data[0] = 'B';
      local_10e._data[1] = '\0';
      local_110._data[0] = 'B';
      local_110._data[1] = '\0';
      cVar4 = mserialize::cx_strcat<1ul,1ul,1ul,1ul>(&local_10a,&local_10c,&local_10e,&local_110);
      local_108._M_dataplus._M_p._0_1_ = cVar4._data[0];
      local_108._M_dataplus._M_p._1_1_ = cVar4._data[1];
      local_108._M_dataplus._M_p._2_1_ = cVar4._data[2];
      local_108._M_dataplus._M_p._3_1_ = cVar4._data[3];
      local_108._M_dataplus._M_p._4_1_ = cVar4._data[4];
      local_50._M_p = (pointer)&local_40;
      sVar5 = strlen((char *)&local_108);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,&local_108,(long)&local_108._M_dataplus._M_p + sVar5);
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        uVar7 = std::__throw_system_error(iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar7);
      }
      local_e8._0_8_ = __mutex[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)__mutex + 0x58));
      _Var2._M_i = __mutex[3].__align;
      __mutex[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(__mutex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,&local_108);
      logUnsigned<unsigned_char>();
    }
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    clock_gettime(0,(timespec *)&local_108);
    lVar8 = (long)local_108._M_dataplus._M_p * 1000000000;
    local_108._M_dataplus._M_p._0_1_ = 0x28;
    binlog::SessionWriter::
    addEvent<unsigned_char&,unsigned_char_const&,unsigned_char_const&,unsigned_char>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,
               lVar8 + local_108._M_string_length,local_112 + 1,local_112,local_112,
               (uchar *)&local_108);
  }
  return;
}

Assistant:

void logUnsigned()
{
  T a = 20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(40));
}